

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycles.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int __how;
  msg_stop *msg;
  actor_ref *this;
  msg_stop local_12;
  msg_start local_11;
  actor_ref analizer;
  
  acto::spawn<Analizer>((acto *)&analizer,exclusive);
  poVar1 = std::operator<<((ostream *)&std::cout,"Statistic is being collected.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Please wait some seconds...");
  std::endl<char,std::char_traits<char>>(poVar1);
  acto::actor_ref::send<msg_start>(&analizer,&local_11);
  acto::this_thread::sleep_for<std::chrono::duration<long,std::ratio<1l,1l>>>
            ((duration<long,_std::ratio<1L,_1L>_>)0x10347b);
  msg = &local_12;
  acto::actor_ref::send<msg_stop>(&analizer,msg);
  __how = (int)msg;
  acto::join(&analizer);
  this = &analizer;
  acto::actor_ref::~actor_ref(this);
  acto::shutdown((int)this,__how);
  poVar1 = std::operator<<((ostream *)&std::cout,":end");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
  {
    acto::actor_ref analizer = acto::spawn< Analizer >(acto::actor_thread::exclusive);
    // -
    std::cout << "Statistic is being collected." << std::endl;
    std::cout << "Please wait some seconds..." << std::endl;
    // Запустить выполнение примера
    analizer.send(msg_start());

    acto::this_thread::sleep_for(std::chrono::seconds(5));
    // Оставноваить выполнение и собрать статистику
    analizer.send(msg_stop());

    acto::join(analizer);
  }
  // Освободить ресурсы
  acto::shutdown();

  std::cout << ":end" << std::endl;

#ifdef ACTO_WIN
  _getch();
#endif

  return 0;
}